

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemo_common.hpp
# Opt level: O0

void doubleCos1D_eval<IMLE>(IMLE *imleObj)

{
  int iVar1;
  Scalar *pSVar2;
  ostream *poVar3;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *this;
  void *pvVar4;
  IMLE *in_RDI;
  double dVar5;
  int k;
  Scal x2;
  Scal x1;
  int i;
  Scal sumErrSqr;
  Scal sumSol;
  Scal err;
  int nSol;
  Vec zTest;
  ArrayX x;
  int nTest;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffffe18;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *in_stack_fffffffffffffe20;
  Z *in_stack_fffffffffffffe28;
  IMLE *in_stack_fffffffffffffe30;
  Scalar *in_stack_fffffffffffffe50;
  Scalar *in_stack_fffffffffffffe58;
  Index in_stack_fffffffffffffe60;
  ostream *in_stack_fffffffffffffeb8;
  ostream *in_stack_fffffffffffffec0;
  int local_104;
  int local_ac;
  double local_a8;
  double local_a0;
  double local_98;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_28;
  undefined4 local_c;
  IMLE *local_8;
  
  local_c = 100;
  local_8 = in_RDI;
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            *)0x2eb7a7);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::LinSpaced
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18)
  ;
  local_a0 = 0.0;
  local_a8 = 0.0;
  for (local_ac = 0; local_ac < 100; local_ac = local_ac + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::row
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffe30,
               (Index)in_stack_fffffffffffffe28);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,1,1,false>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffe20,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_1,_false>_> *)
               in_stack_fffffffffffffe18);
    IMLE::predictMultiple(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x2eb89b);
    iVar1 = IMLE::getNumberOfSolutionsFound(local_8);
    IMLE::getMultiplePredictions(local_8);
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::operator=((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *)in_stack_fffffffffffffec0,
                (vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *)in_stack_fffffffffffffeb8);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (in_stack_fffffffffffffe20,(Index)in_stack_fffffffffffffe18);
    dVar5 = cos(*pSVar2);
    poVar3 = std::operator<<((ostream *)&std::cout,"z = ");
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (in_stack_fffffffffffffe20,(Index)in_stack_fffffffffffffe18);
    in_stack_fffffffffffffec0 = (ostream *)std::ostream::operator<<(poVar3,*pSVar2);
    in_stack_fffffffffffffeb8 = std::operator<<(in_stack_fffffffffffffec0," --> \tTargets: ");
    poVar3 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffeb8,dVar5);
    poVar3 = std::operator<<(poVar3,"   ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar5 + 4.0);
    std::operator<<(poVar3,"\n\t\t    Predictions: ");
    for (local_104 = 0; local_104 < iVar1; local_104 = local_104 + 1) {
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::operator[](&local_28,(long)local_104);
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         (in_stack_fffffffffffffe20,(Index)in_stack_fffffffffffffe18);
      poVar3 = (ostream *)std::ostream::operator<<(&std::cout,*pSVar2);
      std::operator<<(poVar3,"   ");
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::operator[](&local_28,(long)local_104);
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         (in_stack_fffffffffffffe20,(Index)in_stack_fffffffffffffe18);
      if (dVar5 + 2.0 <= *pSVar2) {
        std::
        vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::operator[](&local_28,(long)local_104);
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           (in_stack_fffffffffffffe20,(Index)in_stack_fffffffffffffe18);
        local_98 = *pSVar2 - (dVar5 + 4.0);
      }
      else {
        std::
        vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::operator[](&local_28,(long)local_104);
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           (in_stack_fffffffffffffe20,(Index)in_stack_fffffffffffffe18);
        local_98 = *pSVar2 - dVar5;
      }
      local_a8 = local_98 * local_98 + local_a8;
    }
    local_a0 = local_a0 + (double)iVar1;
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"\t --- doubleCos1D_eval: ---");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"\t\tNumber of experts created: ");
  iVar1 = IMLE::getNumberOfExperts(local_8);
  this = (vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          *)std::ostream::operator<<(poVar3,iVar1);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"\t\tAverage number of predicted solutions: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,local_a0 / 100.0);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"\t\tRMSE: ");
  dVar5 = sqrt(local_a8 / local_a0);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,dVar5);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x2ebdc9);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~vector(this);
  return;
}

Assistant:

void doubleCos1D_eval( Learner &imleObj)
{
	const int nTest = 100;
    typename Learner::ArrayX x;
	Vec zTest = Vec::LinSpaced(100, 0.0, 4*M_PI);
	int nSol;
	Scal err;

	Scal sumSol = 0;
	Scal sumErrSqr = 0.0;

	for( int i = 0; i < nTest; i++)
	{
		imleObj.predictMultiple(zTest.row(i));

		nSol = imleObj.getNumberOfSolutionsFound();
		x = imleObj.getMultiplePredictions();

        Scal x1 = cos(zTest[i]);
        Scal x2 = x1 + 4.0;

        cout << "z = " << zTest[i] << " --> \tTargets: " << x1 << "   " << x2 << "\n\t\t    Predictions: ";
		for(int k = 0; k < nSol; k++)
		{
		    cout << x[k][0] << "   ";

			if( x[k][0] < x1 + 2.0 )	// Getting the closest true value to the IMLE estimate, and using it to calculate the error
				err = x[k][0] - x1;
			else
				err = x[k][0] - x2;

			sumErrSqr += err*err;
		}
		sumSol += nSol;
        cout << endl;
	}
	cout << "\t --- doubleCos1D_eval: ---" << endl;
	cout << "\t\tNumber of experts created: " << imleObj.getNumberOfExperts() << endl;
	cout << "\t\tAverage number of predicted solutions: " << sumSol/nTest << endl;
	cout << "\t\tRMSE: " << sqrt( sumErrSqr / sumSol ) << endl;
}